

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

bool __thiscall ImGuiWS::setDrawData(ImGuiWS *this,ImDrawData *drawData)

{
  uint uVar1;
  int iVar2;
  pointer pIVar3;
  undefined4 extraout_var;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_01;
  undefined8 in_RSI;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_RDI;
  unique_lock<std::shared_mutex> lock;
  DrawListsDiff *drawListsDiff;
  DrawLists *drawLists;
  bool result;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::shared_mutex> *in_stack_ffffffffffffffb0;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  unique_lock<std::shared_mutex> *this_00;
  undefined4 extraout_var_00;
  
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d08c2);
  pIVar3 = std::
           unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
           ::operator->((unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
                         *)0x1d08d1);
  uVar1 = (*pIVar3->_vptr_Interface[2])(pIVar3,in_RSI);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0905);
  pIVar3 = std::
           unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
           ::operator->((unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
                         *)0x1d0914);
  iVar2 = (*pIVar3->_vptr_Interface[3])();
  this_00 = (unique_lock<std::shared_mutex> *)CONCAT44(extraout_var,iVar2);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d092c);
  pIVar3 = std::
           unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
           ::operator->((unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
                         *)0x1d093b);
  iVar2 = (*pIVar3->_vptr_Interface[4])();
  this_01 = (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             *)CONCAT44(extraout_var_00,iVar2);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0953);
  std::unique_lock<std::shared_mutex>::unique_lock
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d0978);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffffc0,in_RDI);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d09a4);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator=(this_01,in_RDI);
  std::unique_lock<std::shared_mutex>::~unique_lock(this_00);
  return (uVar1 & 1) != 0;
}

Assistant:

bool ImGuiWS::setDrawData(const ImDrawData * drawData) {
    bool result = true;

    result &= m_impl->compressorDrawData->setDrawData(drawData);

    auto & drawLists = m_impl->compressorDrawData->getDrawLists();
    auto & drawListsDiff = m_impl->compressorDrawData->getDrawListsDiff();

    // make the draw lists available to incppect clients
    {
        std::unique_lock lock(m_impl->mutex);

        m_impl->dataRead.drawLists = std::move(drawLists);
        m_impl->dataRead.drawListsDiff = std::move(drawListsDiff);
    }

    return result;
}